

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

bool __thiscall IR::Instr::HasFixedFunctionAddressTarget(Instr *this)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  AddrOpnd *pAVar5;
  
  OVar1 = this->m_opcode;
  if (((((5 < OVar1 - 0xc4) || ((0x29U >> (OVar1 - 0xc4 & 0x1f) & 1) == 0)) && (OVar1 != CallI)) &&
      ((OVar1 != NewScObjectSpread && (OVar1 != NewScObjectNoCtor)))) && (OVar1 != CallIFixed)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xd60,
                       "(this->m_opcode == Js::OpCode::CallI || this->m_opcode == Js::OpCode::CallIFixed || this->m_opcode == Js::OpCode::NewScObject || this->m_opcode == Js::OpCode::NewScObjectSpread || this->m_opcode == Js::OpCode::NewScObjArray || this->m_opcode == Js::OpCode::NewScObjArraySpread || this->m_opcode == Js::OpCode::NewScObjectNoCtor)"
                       ,
                       "this->m_opcode == Js::OpCode::CallI || this->m_opcode == Js::OpCode::CallIFixed || this->m_opcode == Js::OpCode::NewScObject || this->m_opcode == Js::OpCode::NewScObjectSpread || this->m_opcode == Js::OpCode::NewScObjArray || this->m_opcode == Js::OpCode::NewScObjArraySpread || this->m_opcode == Js::OpCode::NewScObjectNoCtor"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (((this->m_src1 != (Opnd *)0x0) && (bVar3 = Opnd::IsAddrOpnd(this->m_src1), bVar3)) &&
     (pAVar5 = Opnd::AsAddrOpnd(this->m_src1), pAVar5->addrOpndKind == AddrOpndKindDynamicVar)) {
    pAVar5 = Opnd::AsAddrOpnd(this->m_src1);
    return (bool)((pAVar5->field_0x28 & 2) >> 1);
  }
  return false;
}

Assistant:

bool Instr::HasFixedFunctionAddressTarget() const
{
    Assert(
        this->m_opcode == Js::OpCode::CallI ||
        this->m_opcode == Js::OpCode::CallIFixed ||
        this->m_opcode == Js::OpCode::NewScObject ||
        this->m_opcode == Js::OpCode::NewScObjectSpread ||
        this->m_opcode == Js::OpCode::NewScObjArray ||
        this->m_opcode == Js::OpCode::NewScObjArraySpread ||
        this->m_opcode == Js::OpCode::NewScObjectNoCtor);
    return
        this->GetSrc1() != nullptr &&
        this->GetSrc1()->IsAddrOpnd() &&
        this->GetSrc1()->AsAddrOpnd()->GetAddrOpndKind() == IR::AddrOpndKind::AddrOpndKindDynamicVar &&
        this->GetSrc1()->AsAddrOpnd()->m_isFunction;
}